

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O1

Abc_Obj_t * Abc_NtkMulti_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNodeOld)

{
  byte *pbVar1;
  DdManager *dd;
  void *pvVar2;
  bool bVar3;
  Vec_Ptr_t *vCone;
  void **ppvVar4;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin;
  DdNode *pDVar5;
  long lVar6;
  
  if (((ulong)pNodeOld & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0xb5,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  if ((Abc_Obj_t *)(pNodeOld->field_6).pTemp != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)(pNodeOld->field_6).pTemp;
  }
  if ((*(uint *)&pNodeOld->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0xb9,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  if (pNodeOld->pNtk->ntkType == ABC_NTK_STRASH) {
    if ((*(uint *)&pNodeOld->field_0x14 & 0xf) == 1) {
      __assert_fail("!Abc_AigNodeIsConst(pNodeOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0xba,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    if ((*(uint *)&pNodeOld->field_0x14 & 0x10) == 0) {
      __assert_fail("pNodeOld->fMarkA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0xbb,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    vCone = (Vec_Ptr_t *)malloc(0x10);
    vCone->nCap = 10;
    vCone->nSize = 0;
    ppvVar4 = (void **)malloc(0x50);
    vCone->pArray = ppvVar4;
    vCone->nSize = 0;
    Abc_NtkMultiCone_rec
              ((Abc_Obj_t *)pNodeOld->pNtk->vObjs->pArray[*(pNodeOld->vFanins).pArray],vCone);
    Abc_NtkMultiCone_rec
              ((Abc_Obj_t *)pNodeOld->pNtk->vObjs->pArray[(pNodeOld->vFanins).pArray[1]],vCone);
    pObj = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
    if (vCone->nSize < 1) {
      bVar3 = false;
    }
    else {
      lVar6 = 0;
      do {
        pFanin = Abc_NtkMulti_rec(pNtkNew,(Abc_Obj_t *)vCone->pArray[lVar6]);
        Abc_ObjAddFanin(pObj,pFanin);
        lVar6 = lVar6 + 1;
      } while (lVar6 < vCone->nSize);
      bVar3 = 0 < vCone->nSize;
    }
    if (pNodeOld->pNtk->ntkType == ABC_NTK_STRASH) {
      if ((*(uint *)&pNodeOld->field_0x14 & 0xf) == 1) {
        __assert_fail("!Abc_AigNodeIsConst(pNodeOld)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                      ,0xe3,"DdNode *Abc_NtkMultiDeriveBdd(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)");
      }
      if ((*(uint *)&pNodeOld->field_0x14 & 0xf) == 7) {
        dd = (DdManager *)pNtkNew->pManFunc;
        if (bVar3) {
          lVar6 = 0;
          do {
            pvVar2 = vCone->pArray[lVar6];
            pDVar5 = Cudd_bddIthVar(dd,(int)lVar6);
            *(DdNode **)((long)pvVar2 + 0x38) = pDVar5;
            Cudd_Ref(pDVar5);
            pbVar1 = (byte *)((long)pvVar2 + 0x14);
            *pbVar1 = *pbVar1 | 0x40;
            lVar6 = lVar6 + 1;
          } while (lVar6 < vCone->nSize);
        }
        pDVar5 = Abc_NtkMultiDeriveBdd_rec(dd,pNodeOld,vCone);
        Cudd_Ref(pDVar5);
        if (0 < vCone->nSize) {
          lVar6 = 0;
          do {
            pvVar2 = vCone->pArray[lVar6];
            Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + 0x38));
            pbVar1 = (byte *)((long)pvVar2 + 0x14);
            *pbVar1 = *pbVar1 & 0xbf;
            lVar6 = lVar6 + 1;
          } while (lVar6 < vCone->nSize);
        }
        Cudd_Deref(pDVar5);
        (pObj->field_5).pData = pDVar5;
        Cudd_Ref(pDVar5);
        if (vCone->pArray != (void **)0x0) {
          free(vCone->pArray);
          vCone->pArray = (void **)0x0;
        }
        free(vCone);
        (pNodeOld->field_6).pCopy = pObj;
        return pObj;
      }
      __assert_fail("Abc_ObjIsNode(pNodeOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0xe4,"DdNode *Abc_NtkMultiDeriveBdd(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)");
    }
  }
  __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
}

Assistant:

Abc_Obj_t * Abc_NtkMulti_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNodeOld )
{
    Vec_Ptr_t * vCone;
    Abc_Obj_t * pNodeNew;
    int i;

    assert( !Abc_ObjIsComplement(pNodeOld) );
    // return if the result if known
    if ( pNodeOld->pCopy )
        return pNodeOld->pCopy;
    assert( Abc_ObjIsNode(pNodeOld) );
    assert( !Abc_AigNodeIsConst(pNodeOld) );
    assert( pNodeOld->fMarkA );

//printf( "%d ", Abc_NodeMffcSizeSupp(pNodeOld) );

    // collect the renoding cone
    vCone = Vec_PtrAlloc( 10 );
    Abc_NtkMultiCone( pNodeOld, vCone );

    // create a new node 
    pNodeNew = Abc_NtkCreateNode( pNtkNew ); 
    for ( i = 0; i < vCone->nSize; i++ )
        Abc_ObjAddFanin( pNodeNew, Abc_NtkMulti_rec(pNtkNew, (Abc_Obj_t *)vCone->pArray[i]) );

    // derive the function of this node
    pNodeNew->pData = Abc_NtkMultiDeriveBdd( (DdManager *)pNtkNew->pManFunc, pNodeOld, vCone );    
    Cudd_Ref( (DdNode *)pNodeNew->pData );
    Vec_PtrFree( vCone );

    // remember the node
    pNodeOld->pCopy = pNodeNew;
    return pNodeOld->pCopy;
}